

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,int initSize2,XSerializeEngine *serEng)

{
  QName *pQVar1;
  bool bVar2;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this;
  MemoryManager *manager;
  SchemaElementDecl *valueToAdopt;
  undefined4 in_register_0000000c;
  size_t initSize;
  void *__buf;
  XMLSize_t itemIndex;
  ulong uVar3;
  int scopeKey;
  MemoryManager *local_48;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  
  initSize = CONCAT44(in_register_0000000c,initSize2);
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize(serEng,&hashModulus);
    this = *objToLoad;
    if (this == (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)0x0
       ) {
      local_48 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x40,local_48);
      manager = XSerializeEngine::getMemoryManager(serEng);
      initSize = (size_t)initSize2;
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
      RefHash3KeysIdPool(this,hashModulus,toAdopt,initSize,manager);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    itemNumber = 0;
    XSerializeEngine::readSize(serEng,&itemNumber);
    for (uVar3 = 0; uVar3 < itemNumber; uVar3 = uVar3 + 1) {
      XSerializeEngine::operator>>(serEng,&scopeKey);
      valueToAdopt = (SchemaElementDecl *)XSerializeEngine::read(serEng,0x4344a0,__buf,initSize);
      pQVar1 = (valueToAdopt->super_XMLElementDecl).fElementName;
      initSize = (size_t)(uint)scopeKey;
      RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                (*objToLoad,pQVar1->fLocalPart,pQVar1->fURIId,scopeKey,valueToAdopt);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHash3KeysIdPool<SchemaElementDecl>** objToLoad
                                   , int
                                   , bool                                    toAdopt
                                   , int                                     initSize2
                                   , XSerializeEngine&                       serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHash3KeysIdPool<SchemaElementDecl>(
                                                                   hashModulus
                                                                 , toAdopt
                                                                 , initSize2
                                                                 , serEng.getMemoryManager());
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        int scopeKey;
        SchemaElementDecl*  elemDecl;
        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            serEng>>scopeKey;
            serEng>>elemDecl;

           (*objToLoad)->put(elemDecl->getBaseName()
                            , elemDecl->getURI()
                            , scopeKey
                            , elemDecl);
        }

    }

}